

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

uint32_t gravity_class_size(gravity_vm *vm,gravity_class_t *c)

{
  uint32_t uVar1;
  uint32_t uVar2;
  gravity_delegate_t *pgVar3;
  gravity_delegate_t *delegate;
  uint32_t hash_size;
  uint32_t class_size;
  gravity_class_t *c_local;
  gravity_vm *vm_local;
  
  (c->gc).visited = true;
  uVar2 = c->nivars;
  _hash_size = c;
  c_local = (gravity_class_t *)vm;
  uVar1 = string_size(c->identifier);
  delegate._4_4_ = uVar2 * 0x10 + 0x78 + uVar1;
  delegate._0_4_ = 0;
  gravity_hash_iterate2(_hash_size->htable,gravity_hash_internalsize,&delegate,c_local);
  uVar2 = gravity_hash_memsize(_hash_size->htable);
  delegate._0_4_ = uVar2 + (int)delegate;
  pgVar3 = gravity_vm_delegate((gravity_vm *)c_local);
  if ((_hash_size->xdata != (void *)0x0) && (pgVar3->bridge_size != (gravity_bridge_size)0x0)) {
    uVar2 = (*pgVar3->bridge_size)((gravity_vm *)c_local,(gravity_object_t *)_hash_size->xdata);
    delegate._4_4_ = uVar2 + delegate._4_4_;
  }
  (_hash_size->gc).visited = false;
  return delegate._4_4_;
}

Assistant:

uint32_t gravity_class_size (gravity_vm *vm, gravity_class_t *c) {
    SET_OBJECT_VISITED_FLAG(c, true);
    
    uint32_t class_size = sizeof(gravity_class_t) + (c->nivars * sizeof(gravity_value_t)) + string_size(c->identifier);

    uint32_t hash_size = 0;
    gravity_hash_iterate2(c->htable, gravity_hash_internalsize, (void *)&hash_size, (void *)vm);
    hash_size += gravity_hash_memsize(c->htable);

    gravity_delegate_t *delegate = gravity_vm_delegate(vm);
    if (c->xdata && delegate->bridge_size)
        class_size += delegate->bridge_size(vm, c->xdata);

    SET_OBJECT_VISITED_FLAG(c, false);
    return class_size;
}